

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v11::detail::print(FILE *f,string_view text)

{
  FILE *in_stack_00000030;
  size_t in_stack_00000038;
  void *in_stack_00000040;
  basic_string_view<char> local_10;
  
  basic_string_view<char>::data(&local_10);
  basic_string_view<char>::size(&local_10);
  fwrite_all(in_stack_00000040,in_stack_00000038,in_stack_00000030);
  return;
}

Assistant:

FMT_FUNC void print(std::FILE* f, string_view text) {
#if defined(_WIN32) && !defined(FMT_USE_WRITE_CONSOLE)
  int fd = _fileno(f);
  if (_isatty(fd)) {
    std::fflush(f);
    if (write_console(fd, text)) return;
  }
#endif
  fwrite_all(text.data(), text.size(), f);
}